

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O2

void Llb_MtrPrintMatrixStats(Llb_Mtr_t *p)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  char *format;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar1 = p->nRows;
  __ptr = calloc((long)(int)uVar1,4);
  __ptr_00 = calloc((long)(int)uVar1,4);
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  iVar6 = 0;
  do {
    if (uVar3 == uVar2) {
      uVar12 = p->nCols;
      uVar10 = 0;
      uVar5 = 0;
      if (0 < (int)uVar12) {
        uVar5 = uVar12;
      }
      uVar4 = 0;
      uVar3 = 0;
      for (; uVar10 != uVar5; uVar10 = uVar10 + 1) {
        uVar7 = uVar4;
        for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
          uVar7 = uVar7 + (*(uint *)((long)__ptr + uVar9 * 4) == uVar10);
        }
        uVar4 = uVar7;
        for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
          uVar4 = uVar4 - (*(uint *)((long)__ptr_00 + uVar9 * 4) == uVar10);
        }
        if ((int)uVar3 <= (int)uVar7) {
          uVar3 = (ulong)uVar7;
        }
      }
      free(__ptr);
      free(__ptr_00);
      iVar8 = 0x7d4e8c;
      format = (char *)(ulong)uVar12;
      printf("[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n",(double)iVar6 / (double)(int)uVar1,
             format,(ulong)uVar1,uVar3);
      if (uVar4 == 0) {
        return;
      }
      Abc_Print(iVar8,format,(ulong)uVar4);
      return;
    }
    if (p->pRowSums[uVar3] != 0) {
      uVar12 = p->nCols;
      uVar9 = 0;
      if (0 < (int)uVar12) {
        uVar9 = (ulong)uVar12;
      }
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        if (p->pMatrix[uVar11][uVar3] == '\x01') {
          uVar9 = uVar11 & 0xffffffff;
          break;
        }
      }
      uVar10 = (int)uVar12 >> 0x1f & uVar12;
      uVar5 = uVar12;
      do {
        uVar12 = uVar12 - 1;
        uVar4 = uVar10 - 1;
        uVar7 = uVar10;
        if ((int)uVar5 < 1) break;
        uVar4 = uVar5 - 1;
        uVar7 = uVar5;
        uVar5 = uVar4;
      } while (p->pMatrix[uVar12][uVar3] != '\x01');
      iVar8 = (int)uVar9;
      if ((int)uVar7 <= iVar8) {
        __assert_fail("iGrp1 <= iGrp2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Matrix.c"
                      ,0xfb,"void Llb_MtrPrintMatrixStats(Llb_Mtr_t *)");
      }
      *(int *)((long)__ptr + uVar3 * 4) = iVar8;
      *(uint *)((long)__ptr_00 + uVar3 * 4) = uVar4;
      iVar6 = (iVar6 - iVar8) + uVar4;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void Llb_MtrPrintMatrixStats( Llb_Mtr_t * p )
{
    int iVar, iGrp, iGrp1, iGrp2, Span = 0, nCutSize = 0, nCutSizeMax = 0;
    int * pGrp1 = ABC_CALLOC( int, p->nRows ); 
    int * pGrp2 = ABC_CALLOC( int, p->nRows ); 
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pRowSums[iVar] == 0 )
            continue;
        for ( iGrp1 = 0; iGrp1 < p->nCols; iGrp1++ )
            if ( p->pMatrix[iGrp1][iVar] == 1 )
                break;
        for ( iGrp2 = p->nCols - 1; iGrp2 >= 0; iGrp2-- )
            if ( p->pMatrix[iGrp2][iVar] == 1 )
                break;
        assert( iGrp1 <= iGrp2 );
        pGrp1[iVar] = iGrp1;
        pGrp2[iVar] = iGrp2;
        Span += iGrp2 - iGrp1;
    }
    // compute span
    for ( iGrp = 0; iGrp < p->nCols; iGrp++ )
    {
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp1[iVar] == iGrp )
                nCutSize++;
        if ( nCutSizeMax < nCutSize )
            nCutSizeMax = nCutSize;
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp2[iVar] == iGrp )
                nCutSize--;
    }
    ABC_FREE( pGrp1 );
    ABC_FREE( pGrp2 );
    printf( "[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n", 
        p->nCols, p->nRows, 1.0*Span/p->nRows, nCutSizeMax );
    if ( nCutSize )
        Abc_Print( -1, "Cut size is not zero (%d).\n", nCutSize );
}